

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O1

void pzgeom::TPZQuadraticLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Fad<double> qsi;
  Fad<double> local_a8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  local_88;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *local_78;
  double local_70;
  double dStack_68;
  Fad<double> *local_60;
  undefined1 *local_58;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_50;
  
  pFVar2 = loc->fStore;
  local_a8.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_a8.dx_.ptr_to_data = (double *)0x0;
  local_a8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (long)(int)uVar1 << 3;
    }
    local_a8.dx_.ptr_to_data = (double *)operator_new__(uVar7);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_a8.dx_.ptr_to_data,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_a8.defaultVal = pFVar2->defaultVal;
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
  local_78 = &local_88;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_58 = (undefined1 *)&local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_58 = (undefined1 *)&local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)&local_78);
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
    local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
    local_78 = &local_88;
    local_58 = (undefined1 *)&local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
  local_78 = &local_88;
  local_58 = (undefined1 *)&local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)&local_78);
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 1.0;
  dStack_68 = 0.0;
  local_88.fadexpr_.left_ = &local_50;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_78;
  if ((2 < (phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
     (0 < (phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    local_60 = &local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    Fad<double>::operator=(phi->fElem + 2,&local_88);
    iVar3 = local_a8.dx_.num_elts;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = dphi->fElem;
    uVar7 = (ulong)(uint)local_a8.dx_.num_elts;
    uVar1 = (pFVar2->dx_).num_elts;
    if (local_a8.dx_.num_elts != uVar1) {
      if (local_a8.dx_.num_elts == 0) {
        if (uVar1 != 0) {
          pdVar5 = (pFVar2->dx_).ptr_to_data;
          if (pdVar5 != (double *)0x0) {
            operator_delete__(pdVar5);
          }
          (pFVar2->dx_).num_elts = 0;
          (pFVar2->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar8 = (long)local_a8.dx_.num_elts;
        if (uVar1 != 0) {
          pdVar5 = (pFVar2->dx_).ptr_to_data;
          if (pdVar5 != (double *)0x0) {
            operator_delete__(pdVar5);
          }
          (pFVar2->dx_).num_elts = 0;
          (pFVar2->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar2->dx_).num_elts = iVar3;
        uVar6 = 0xffffffffffffffff;
        if (-1 < iVar3) {
          uVar6 = lVar8 << 3;
        }
        pdVar5 = (double *)operator_new__(uVar6);
        (pFVar2->dx_).ptr_to_data = pdVar5;
      }
    }
    iVar4 = local_a8.dx_.num_elts;
    if (iVar3 != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
      if (local_a8.dx_.num_elts == 0) {
        if (0 < iVar3) {
          uVar6 = 0;
          do {
            pdVar5[uVar6] = local_a8.defaultVal;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
      }
      else if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
    pFVar2->val_ = local_a8.val_ + -0.5;
    if ((0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
       (1 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
      lVar8 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem + lVar8;
      uVar7 = (ulong)(uint)local_a8.dx_.num_elts;
      uVar1 = dphi->fElem[lVar8].dx_.num_elts;
      if (local_a8.dx_.num_elts != uVar1) {
        if (local_a8.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar5 = (pFVar2->dx_).ptr_to_data;
            if (pdVar5 != (double *)0x0) {
              operator_delete__(pdVar5);
            }
            (pFVar2->dx_).num_elts = 0;
            (pFVar2->dx_).ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar8 = (long)local_a8.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar5 = (pFVar2->dx_).ptr_to_data;
            if (pdVar5 != (double *)0x0) {
              operator_delete__(pdVar5);
            }
            (pFVar2->dx_).num_elts = 0;
            (pFVar2->dx_).ptr_to_data = (double *)0x0;
          }
          (pFVar2->dx_).num_elts = iVar4;
          uVar6 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar6 = lVar8 << 3;
          }
          pdVar5 = (double *)operator_new__(uVar6);
          (pFVar2->dx_).ptr_to_data = pdVar5;
        }
      }
      iVar3 = local_a8.dx_.num_elts;
      if (iVar4 != 0) {
        pdVar5 = (pFVar2->dx_).ptr_to_data;
        if (local_a8.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar6 = 0;
            do {
              pdVar5[uVar6] = local_a8.defaultVal;
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
        }
        else if (0 < iVar4) {
          uVar6 = 0;
          do {
            pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
      }
      pFVar2->val_ = local_a8.val_ + 0.5;
      if ((0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
         (2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
        lVar8 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        pFVar2 = dphi->fElem;
        uVar7 = (ulong)(uint)local_a8.dx_.num_elts;
        uVar1 = pFVar2[lVar8 * 2].dx_.num_elts;
        if (local_a8.dx_.num_elts != uVar1) {
          if (local_a8.dx_.num_elts == 0) {
            if (uVar1 != 0) {
              pdVar5 = pFVar2[lVar8 * 2].dx_.ptr_to_data;
              if (pdVar5 != (double *)0x0) {
                operator_delete__(pdVar5);
              }
              pFVar2[lVar8 * 2].dx_.num_elts = 0;
              pFVar2[lVar8 * 2].dx_.ptr_to_data = (double *)0x0;
            }
          }
          else {
            lVar9 = (long)local_a8.dx_.num_elts;
            if (uVar1 != 0) {
              pdVar5 = pFVar2[lVar8 * 2].dx_.ptr_to_data;
              if (pdVar5 != (double *)0x0) {
                operator_delete__(pdVar5);
              }
              pFVar2[lVar8 * 2].dx_.num_elts = 0;
              pFVar2[lVar8 * 2].dx_.ptr_to_data = (double *)0x0;
            }
            pFVar2[lVar8 * 2].dx_.num_elts = iVar3;
            uVar6 = 0xffffffffffffffff;
            if (-1 < iVar3) {
              uVar6 = lVar9 << 3;
            }
            pdVar5 = (double *)operator_new__(uVar6);
            pFVar2[lVar8 * 2].dx_.ptr_to_data = pdVar5;
          }
        }
        if (iVar3 != 0) {
          pdVar5 = pFVar2[lVar8 * 2].dx_.ptr_to_data;
          if (local_a8.dx_.num_elts == 0) {
            if (0 < iVar3) {
              uVar6 = 0;
              do {
                pdVar5[uVar6] = local_a8.defaultVal * -2.0;
                uVar6 = uVar6 + 1;
              } while (uVar7 != uVar6);
            }
          }
          else if (0 < iVar3) {
            uVar6 = 0;
            do {
              pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8) * -2.0;
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
        }
        pFVar2[lVar8 * 2].val_ = local_a8.val_ * -2.0;
        Fad<double>::~Fad(&local_a8);
        return;
      }
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_60 = &local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}